

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.h
# Opt level: O2

void __thiscall
icu_63::UnicodeSet::retain(UnicodeSet *this,UChar32 *other,int32_t otherLen,int8_t polarity)

{
  int *piVar1;
  UChar32 *pUVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  UChar32 UVar7;
  int iVar8;
  undefined8 uStack_38;
  UErrorCode status;
  
  if ((this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0) &&
     ((this->fFlags & 1) == 0)) {
    uStack_38 = 0;
    ensureBufferCapacity(this,otherLen + this->len,&status);
    if (status < U_ILLEGAL_ARGUMENT_ERROR) {
      piVar1 = this->list;
      pUVar2 = this->buffer;
      iVar4 = *piVar1;
      UVar7 = *other;
      iVar3 = 0;
      iVar5 = 1;
      iVar8 = 1;
LAB_002cab9d:
      do {
      } while (3 < (byte)polarity);
      switch(polarity) {
      case '\0':
        if (iVar4 < UVar7) {
          iVar4 = piVar1[iVar5];
          polarity = 1;
          iVar5 = iVar5 + 1;
          goto LAB_002cab9d;
        }
        if (UVar7 < iVar4) {
LAB_002cacc2:
          UVar7 = other[iVar8];
          polarity = 2;
          iVar8 = iVar8 + 1;
          goto LAB_002cab9d;
        }
        if (iVar4 == 0x110000) {
LAB_002cacd2:
          pUVar2[iVar3] = 0x110000;
          this->len = iVar3 + 1;
          swapBuffers(this);
          releasePattern(this);
          return;
        }
        pUVar2[iVar3] = iVar4;
        iVar6 = iVar5 + 1;
        iVar4 = piVar1[iVar5];
        break;
      case '\x01':
        if (iVar4 < UVar7) {
          iVar4 = piVar1[iVar5];
          polarity = 0;
          iVar5 = iVar5 + 1;
          goto LAB_002cab9d;
        }
        if (iVar4 <= UVar7) {
          if (iVar4 != 0x110000) {
            iVar4 = piVar1[iVar5];
            iVar5 = iVar5 + 1;
            goto LAB_002cacc2;
          }
          goto LAB_002cacd2;
        }
        pUVar2[iVar3] = UVar7;
        iVar6 = iVar5;
        break;
      case '\x02':
        if (UVar7 < iVar4) {
LAB_002caca3:
          UVar7 = other[iVar8];
          polarity = 0;
          iVar8 = iVar8 + 1;
        }
        else if (iVar4 < UVar7) {
          pUVar2[iVar3] = iVar4;
          iVar4 = piVar1[iVar5];
          polarity = 3;
          iVar3 = iVar3 + 1;
          iVar5 = iVar5 + 1;
        }
        else {
          if (iVar4 == 0x110000) goto LAB_002cacd2;
          iVar6 = iVar5 + 1;
          iVar4 = piVar1[iVar5];
LAB_002cac7a:
          UVar7 = other[iVar8];
          polarity = 1;
          iVar5 = iVar6;
          iVar8 = iVar8 + 1;
        }
        goto LAB_002cab9d;
      case '\x03':
        if (iVar4 < UVar7) goto code_r0x002cabf6;
        if (UVar7 < iVar4) {
          pUVar2[iVar3] = UVar7;
          iVar3 = iVar3 + 1;
          iVar6 = iVar5;
          goto LAB_002cac7a;
        }
        if (iVar4 != 0x110000) {
          pUVar2[iVar3] = iVar4;
          iVar4 = piVar1[iVar5];
          iVar3 = iVar3 + 1;
          iVar5 = iVar5 + 1;
          goto LAB_002caca3;
        }
        goto LAB_002cacd2;
      }
      iVar3 = iVar3 + 1;
      UVar7 = other[iVar8];
      polarity = 3;
      iVar5 = iVar6;
      iVar8 = iVar8 + 1;
      goto LAB_002cab9d;
    }
  }
  return;
code_r0x002cabf6:
  pUVar2[iVar3] = iVar4;
  iVar4 = piVar1[iVar5];
  polarity = 2;
  iVar3 = iVar3 + 1;
  iVar5 = iVar5 + 1;
  goto LAB_002cab9d;
}

Assistant:

inline UBool UnicodeSet::isFrozen() const {
    return (UBool)(bmpSet!=NULL || stringSpan!=NULL);
}